

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::setVersion(Header *this,int version)

{
  ArgExc *this_00;
  int in_ESI;
  Attribute *in_stack_000005a0;
  char *in_stack_000005a8;
  Header *in_stack_000005b0;
  char *in_stack_ffffffffffffffb8;
  TypedAttribute<int> *in_stack_ffffffffffffffc0;
  int local_30 [12];
  
  if (in_ESI != 1) {
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc(this_00,in_stack_ffffffffffffffb8);
    __cxa_throw(this_00,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  TypedAttribute<int>::TypedAttribute(in_stack_ffffffffffffffc0,local_30);
  insert(in_stack_000005b0,in_stack_000005a8,in_stack_000005a0);
  TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)0x124387);
  return;
}

Assistant:

void
Header::setVersion (const int version)
{
    if (version != 1)
    {
        throw IEX_NAMESPACE::ArgExc ("We can only process version 1");
    }

    insert ("version", IntAttribute (version));
}